

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CollectiveDipoleDisplacement.cpp
# Opt level: O0

Vector3d * __thiscall
OpenMD::CollectiveDipoleDisplacement::calcCorrVal
          (CollectiveDipoleDisplacement *this,int frame1,int frame2)

{
  Vector<double,_3U> *v2;
  Vector<double,_3U> *v1;
  int in_ECX;
  int in_EDX;
  Vector3<double> *in_RSI;
  Vector3d *in_RDI;
  RealType drot;
  RealType dtot;
  RealType dcm;
  Vector3d diff;
  double in_stack_ffffffffffffff38;
  Vector<double,_3U> *in_stack_ffffffffffffff48;
  
  Vector3<double>::Vector3((Vector3<double> *)0x138e1c);
  v2 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                  ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                   (in_RSI[0x98].super_Vector<double,_3U>.data_ + 1),(long)in_ECX)->
        super_Vector<double,_3U>;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
             (in_RSI[0x98].super_Vector<double,_3U>.data_ + 1),(long)in_EDX);
  OpenMD::operator-(in_stack_ffffffffffffff48,v2);
  Vector3<double>::operator=((Vector3<double> *)in_stack_ffffffffffffff48,v2);
  Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x138e84);
  v1 = &std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
                  ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                   (in_RSI[0x99].super_Vector<double,_3U>.data_ + 1),(long)in_ECX)->
        super_Vector<double,_3U>;
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
             (in_RSI[0x99].super_Vector<double,_3U>.data_ + 1),(long)in_EDX);
  OpenMD::operator-(v1,v2);
  Vector3<double>::operator=((Vector3<double> *)v1,v2);
  Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x138ef5);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
             (in_RSI[0x9a].super_Vector<double,_3U>.data_ + 1),(long)in_ECX);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
             (in_RSI[0x9a].super_Vector<double,_3U>.data_ + 1),(long)in_EDX);
  OpenMD::operator-(v1,v2);
  Vector3<double>::operator=((Vector3<double> *)v1,v2);
  Vector<double,_3U>::lengthSquare((Vector<double,_3U> *)0x138f66);
  Vector3<double>::Vector3(in_RSI,(double)v1,(double)v2,in_stack_ffffffffffffff38);
  return in_RDI;
}

Assistant:

Vector3d CollectiveDipoleDisplacement::calcCorrVal(int frame1, int frame2) {
    Vector3d diff;
    RealType dcm, dtot, drot;
    diff = CRcm_[frame2] - CRcm_[frame1];
    dcm  = diff.lengthSquare();
    diff = CRtot_[frame2] - CRtot_[frame1];
    dtot = diff.lengthSquare();
    diff = CRrot_[frame2] - CRrot_[frame1];
    drot = diff.lengthSquare();

    return Vector3d(dcm, dtot, drot);
  }